

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlockData.cpp
# Opt level: O2

void __thiscall
libmatroska::KaxReferenceBlock::SetReferencedBlock(KaxReferenceBlock *this,KaxBlockBlob *aRefdBlock)

{
  uint __line;
  char *__assertion;
  
  if (this->RefdBlock == (KaxBlockBlob *)0x0) {
    if (aRefdBlock != (KaxBlockBlob *)0x0) {
      FreeBlob(this);
      this->RefdBlock = aRefdBlock;
      this->bOurBlob = true;
      (this->super_EbmlSInteger).super_EbmlElement.bValueIsSet = true;
      return;
    }
    __assertion = "aRefdBlock != NULL";
    __line = 0x61;
  }
  else {
    __assertion = "RefdBlock == NULL";
    __line = 0x60;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlockData.cpp"
                ,__line,
                "void libmatroska::KaxReferenceBlock::SetReferencedBlock(const KaxBlockBlob *)");
}

Assistant:

void KaxReferenceBlock::SetReferencedBlock(const KaxBlockBlob * aRefdBlock)
{
  assert(RefdBlock == NULL);
  assert(aRefdBlock != NULL);
  FreeBlob();
  RefdBlock = aRefdBlock;
  bOurBlob = true;
  SetValueIsSet();
}